

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

void clask::serve_file(response_writer *resp,request *req,string *path)

{
  wchar_t *pwVar1;
  pointer ppVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  iterator iVar6;
  ulong __val;
  long lVar7;
  long lVar8;
  long lVar9;
  tm *__tp;
  time_t tVar10;
  time_t tVar11;
  ulong uVar12;
  char cVar13;
  wchar_t *pwVar14;
  pointer ppVar15;
  _Put_time<char> __f;
  undefined1 auVar16 [16];
  time_t tt;
  path fspath;
  wstring wpath;
  stringstream date;
  ifstream is;
  char buf [8192];
  key_type local_24d0;
  string local_24b0;
  string local_2490;
  string local_2470;
  string local_2450;
  string local_2430;
  path local_2410;
  wstring local_23e8;
  undefined1 local_23c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_23b8 [7];
  ios_base local_2348 [264];
  long local_2240 [4];
  byte abStack_2220 [488];
  undefined1 local_2038 [32];
  undefined8 local_2018;
  long lStack_2010;
  char *local_2008;
  
  to_wstring(&local_23e8,path);
  local_2038._0_8_ = local_23e8._M_dataplus._M_p;
  std::filesystem::__cxx11::path::path<wchar_t_const*,std::filesystem::__cxx11::path>
            (&local_2410,(wchar_t **)local_2038,auto_format);
  std::ifstream::ifstream(local_2240,local_2410._M_pathname._M_dataplus._M_p,_S_in|_S_bin);
  if ((abStack_2220[*(long *)(local_2240[0] + -0x18)] & 5) == 0) {
    auVar16 = std::filesystem::__cxx11::path::_M_find_extension();
    if (auVar16._8_8_ == -1 || auVar16._0_8_ == 0) {
      std::filesystem::__cxx11::path::path((path *)local_2038);
    }
    else {
      std::__cxx11::string::substr((ulong)local_23c8,auVar16._0_8_);
      std::filesystem::__cxx11::path::path((path *)local_2038,(string_type *)local_23c8,auto_format)
      ;
      if ((undefined1 *)local_23c8._0_8_ != local_23c8 + 0x10) {
        operator_delete((void *)local_23c8._0_8_,local_23b8[0]._M_allocated_capacity + 1);
      }
    }
    local_24d0._M_dataplus._M_p = (pointer)&local_24d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_24d0,local_2038._0_8_,(pointer)(local_2038._0_8_ + local_2038._8_8_)
              );
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)content_types_abi_cxx11_,&local_24d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_24d0._M_dataplus._M_p != &local_24d0.field_2) {
      operator_delete(local_24d0._M_dataplus._M_p,local_24d0.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)local_2038);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      local_2450._M_dataplus._M_p = (pointer)&local_2450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2450,"content-type","");
      response_writer::set_header
                (resp,&local_2450,
                 (string *)
                 ((long)iVar6.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x28));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2450._M_dataplus._M_p != &local_2450.field_2) {
        operator_delete(local_2450._M_dataplus._M_p,local_2450.field_2._M_allocated_capacity + 1);
      }
    }
    __val = std::filesystem::file_size(&local_2410);
    local_2470._M_dataplus._M_p = (pointer)&local_2470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2470,"content-length","");
    cVar13 = '\x01';
    if (9 < __val) {
      uVar12 = __val;
      cVar4 = '\x04';
      do {
        cVar13 = cVar4;
        if (uVar12 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_0010b2b8;
        }
        if (uVar12 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_0010b2b8;
        }
        if (uVar12 < 10000) goto LAB_0010b2b8;
        bVar3 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar4 = cVar13 + '\x04';
      } while (bVar3);
      cVar13 = cVar13 + '\x01';
    }
LAB_0010b2b8:
    pwVar1 = (wchar_t *)(local_2038 + 0x10);
    local_2038._0_8_ = pwVar1;
    std::__cxx11::string::_M_construct((ulong)local_2038,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_2038._0_8_,local_2038._8_4_,__val);
    response_writer::set_header(resp,&local_2470,(string *)local_2038);
    if ((wchar_t *)local_2038._0_8_ != pwVar1) {
      operator_delete((void *)local_2038._0_8_,local_2038._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2470._M_dataplus._M_p != &local_2470.field_2) {
      operator_delete(local_2470._M_dataplus._M_p,local_2470.field_2._M_allocated_capacity + 1);
    }
    lVar7 = std::filesystem::last_write_time(&local_2410);
    lVar8 = std::chrono::_V2::system_clock::now();
    lVar9 = std::chrono::_V2::system_clock::now();
    local_24d0._M_dataplus._M_p =
         (pointer)((lVar9 + 0x59572d4cbf520000 + (lVar7 - lVar8)) / 1000000000);
    __tp = gmtime((time_t *)&local_24d0);
    ppVar2 = (req->headers).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar15 = (req->headers).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar2;
        ppVar15 = ppVar15 + 1) {
      iVar5 = std::__cxx11::string::compare((char *)ppVar15);
      if (iVar5 == 0) {
        local_2018._0_4_ = 0;
        local_2018._4_4_ = 0;
        lStack_2010 = 0;
        local_2038._16_8_ = 0;
        local_2038._24_8_ = 0;
        local_2038._0_8_ = (wchar_t *)0x0;
        local_2038._8_8_ = 0;
        local_2008 = (char *)0x0;
        tVar10 = mktime((tm *)local_2038);
        tVar11 = mktime(__tp);
        if (tVar10 <= tVar11) {
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&resp->headers,
                            (resp->headers).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          resp->code = 0x130;
          local_2490._M_dataplus._M_p = (pointer)&local_2490.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2490,"content-type","");
          pwVar1 = (wchar_t *)(local_23c8 + 0x10);
          local_23c8._0_8_ = pwVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_23c8,"text/plain","");
          response_writer::set_header(resp,&local_2490,(string *)local_23c8);
          if ((wchar_t *)local_23c8._0_8_ != pwVar1) {
            operator_delete((void *)local_23c8._0_8_,local_23b8[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2490._M_dataplus._M_p != &local_2490.field_2) {
            operator_delete(local_2490._M_dataplus._M_p,local_2490.field_2._M_allocated_capacity + 1
                           );
          }
          local_23c8._0_8_ = pwVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_23c8,"Not Modified","");
          (**resp->_vptr_response_writer)(resp,local_23c8);
          pwVar14 = (wchar_t *)local_23c8._0_8_;
          if ((wchar_t *)local_23c8._0_8_ == pwVar1) goto LAB_0010b504;
          goto LAB_0010b0db;
        }
        break;
      }
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_23c8);
    __f._M_fmt = "%a, %d %B %Y %H:%M:%S GMT";
    __f._M_tmb = (tm *)__tp;
    std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)(local_23c8 + 0x10),__f);
    local_24b0._M_dataplus._M_p = (pointer)&local_24b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_24b0,"last-modified","");
    std::__cxx11::stringbuf::str();
    response_writer::set_header(resp,&local_24b0,(string *)local_2038);
    if ((wchar_t *)local_2038._0_8_ != pwVar1) {
      operator_delete((void *)local_2038._0_8_,local_2038._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_24b0._M_dataplus._M_p != &local_24b0.field_2) {
      operator_delete(local_24b0._M_dataplus._M_p,local_24b0.field_2._M_allocated_capacity + 1);
    }
    while ((abStack_2220[*(long *)(local_2240[0] + -0x18)] & 2) == 0) {
      lVar7 = std::istream::read((char *)local_2240,(long)local_2038);
      (*resp->_vptr_response_writer[1])(resp,local_2038,*(undefined8 *)(lVar7 + 8));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_23c8);
    std::ios_base::~ios_base(local_2348);
  }
  else {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase_at_end(&resp->headers,
                      (resp->headers).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    resp->code = 0x194;
    local_2430._M_dataplus._M_p = (pointer)&local_2430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2430,"content-type","");
    pwVar1 = (wchar_t *)(local_2038 + 0x10);
    local_2038._0_8_ = pwVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2038,"text/plain","");
    response_writer::set_header(resp,&local_2430,(string *)local_2038);
    if ((wchar_t *)local_2038._0_8_ != pwVar1) {
      operator_delete((void *)local_2038._0_8_,local_2038._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2430._M_dataplus._M_p != &local_2430.field_2) {
      operator_delete(local_2430._M_dataplus._M_p,local_2430.field_2._M_allocated_capacity + 1);
    }
    local_2038._0_8_ = pwVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2038,"Not Found","");
    (**resp->_vptr_response_writer)(resp,local_2038);
    local_23b8[0]._0_8_ = local_2038._16_8_;
    pwVar14 = (wchar_t *)local_2038._0_8_;
    if ((wchar_t *)local_2038._0_8_ != pwVar1) {
LAB_0010b0db:
      operator_delete(pwVar14,local_23b8[0]._0_8_ + 1);
    }
  }
LAB_0010b504:
  std::ifstream::~ifstream(local_2240);
  std::filesystem::__cxx11::path::~path(&local_2410);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_23e8._M_dataplus._M_p != &local_23e8.field_2) {
    operator_delete(local_23e8._M_dataplus._M_p,local_23e8.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

inline void serve_file(response_writer& resp, request& req, const std::string& path) {
  auto wpath = to_wstring(path);
  std::filesystem::path fspath(wpath.c_str());

  std::ifstream is(fspath, std::ios::in | std::ios::binary);
  if (is.fail()) {
    resp.clear_header();
    resp.code = 404;
    resp.set_header("content-type", "text/plain");
    resp.write("Not Found");
    return;
  }

  auto it = content_types.find(fspath.extension().string());
  if (it != content_types.end()) {
    resp.set_header("content-type", it->second);
  }

  std::uintmax_t size = std::filesystem::file_size(fspath);
  resp.set_header("content-length", std::to_string(size));

  std::filesystem::file_time_type file_time = std::filesystem::last_write_time(fspath);
  std::time_t tt = to_time_t(file_time);
  std::tm *gmt = std::gmtime(&tt);
  for (auto& h : req.headers) {
    if (h.first == "If-Modified-Since") {
      std::tm file_gmt{};
      (void) std::get_time(&file_gmt, h.second.c_str());
      if (std::mktime(&file_gmt) <= std::mktime(gmt)) {
        resp.clear_header();
        resp.code = 304;
        resp.set_header("content-type", "text/plain");
        resp.write("Not Modified");
        return;
      }
      break;
    }
  }

  std::stringstream date;
  date << std::put_time(gmt, "%a, %d %B %Y %H:%M:%S GMT");
  resp.set_header("last-modified", date.str());

  char buf[BUFSIZ];
  while (!is.eof()) {
    resp.write(buf, (size_t) is.read(buf, sizeof(buf)).gcount());
  }
}